

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::TestExceptionCallback::logMessage
          (TestExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  ProcessContext *pPVar1;
  size_t sVar2;
  String *params_4;
  char **params_1;
  String *params_3;
  Repeat<char> RVar3;
  ArrayPtr<void_*> space;
  String *in_stack_fffffffffffffda0;
  StringPtr local_228;
  void **local_218;
  void **ppvStack_210;
  String local_208;
  String local_1f0;
  String local_1d8;
  StringPtr local_1c0;
  undefined1 local_1aa;
  char local_1a9;
  kj local_1a8 [8];
  size_t local_1a0;
  String local_198;
  String local_170;
  kj *local_158;
  void **local_150;
  undefined1 auStack_148 [8];
  ArrayPtr<void_*const> trace;
  void *traceSpace [32];
  String *text_local;
  int contextDepth_local;
  int line_local;
  char *file_local;
  TestExceptionCallback *pTStack_10;
  LogSeverity severity_local;
  TestExceptionCallback *this_local;
  
  text_local._0_4_ = contextDepth;
  text_local._4_4_ = line;
  _contextDepth_local = file;
  file_local._4_4_ = severity;
  pTStack_10 = this;
  ArrayPtr<void*>::ArrayPtr<32ul>((ArrayPtr<void*> *)&local_158,(void *(*) [32])&trace.size_);
  space.size_ = 2;
  space.ptr = local_150;
  _auStack_148 = getStackTrace(local_158,space,line);
  sVar2 = String::size(text);
  if (sVar2 == 0) {
    heapString(&local_170,"expectation failed");
    String::operator=(text,&local_170);
    String::~String(&local_170);
  }
  local_1a9 = '_';
  RVar3 = repeat<char>(&local_1a9,(long)(int)text_local);
  local_1a0 = RVar3.count;
  local_1a8[0] = (kj)RVar3.value;
  local_1aa = 0x3a;
  params_4 = mv<kj::String>(text);
  params_3 = (String *)0x266d1d;
  params_1 = (char **)&local_1aa;
  str<kj::Repeat<char>,char_const*&,char,int&,char_const(&)[3],kj::String>
            (&local_198,local_1a8,(Repeat<char> *)&contextDepth_local,params_1,
             (char *)((long)&text_local + 4),(int *)0x266d1d,(char (*) [3])params_4,
             in_stack_fffffffffffffda0);
  String::operator=(text,&local_198);
  String::~String(&local_198);
  if ((file_local._4_4_ == ERROR) || (file_local._4_4_ == FATAL)) {
    this->sawError = true;
    pPVar1 = this->context;
    strArray<kj::ArrayPtr<void*const>&>
              (&local_1f0,(kj *)auStack_148,(ArrayPtr<void_*const> *)0x26d581,(char *)params_1);
    local_218 = (void **)auStack_148;
    ppvStack_210 = trace.ptr;
    stringifyStackTrace(&local_208,_auStack_148);
    str<kj::String&,char_const(&)[9],kj::String,kj::String>
              (&local_1d8,(kj *)text,(String *)0x26eb87,(char (*) [9])&local_1f0,&local_208,params_3
              );
    StringPtr::StringPtr(&local_1c0,&local_1d8);
    (*pPVar1->_vptr_ProcessContext[3])(pPVar1,local_1c0.content.ptr,local_1c0.content.size_);
    String::~String(&local_1d8);
    String::~String(&local_208);
    String::~String(&local_1f0);
  }
  else {
    pPVar1 = this->context;
    StringPtr::StringPtr(&local_228,text);
    (*pPVar1->_vptr_ProcessContext[2])(pPVar1,local_228.content.ptr,local_228.content.size_);
  }
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    void* traceSpace[32];
    auto trace = getStackTrace(traceSpace, 2);

    if (text.size() == 0) {
      text = kj::heapString("expectation failed");
    }

    text = kj::str(kj::repeat('_', contextDepth), file, ':', line, ": ", kj::mv(text));

    if (severity == LogSeverity::ERROR || severity == LogSeverity::FATAL) {
      sawError = true;
      context.error(kj::str(text, "\nstack: ", strArray(trace, " "), stringifyStackTrace(trace)));
    } else {
      context.warning(text);
    }
  }